

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalNinjaMultiGenerator::OrderDependsTargetForTarget
          (string *__return_storage_ptr__,cmGlobalNinjaMultiGenerator *this,
          cmGeneratorTarget *target,string *config)

{
  string *str;
  string local_b0;
  char local_89;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  string *local_28;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmGlobalNinjaMultiGenerator *this_local;
  
  local_28 = config;
  config_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  this_local = (cmGlobalNinjaMultiGenerator *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_58,"cmake_object_order_depends_target_");
  str = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)config_local);
  cmAlphaNum::cmAlphaNum(&local_88,str);
  local_89 = '_';
  cmsys::SystemTools::UpperCase(&local_b0,local_28);
  cmStrCat<char,std::__cxx11::string>
            (__return_storage_ptr__,&local_58,&local_88,&local_89,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaMultiGenerator::OrderDependsTargetForTarget(
  cmGeneratorTarget const* target, const std::string& config) const
{
  return cmStrCat("cmake_object_order_depends_target_", target->GetName(), '_',
                  cmSystemTools::UpperCase(config));
}